

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

void __thiscall HighFreqDataType::HighFreqDataType(HighFreqDataType *this)

{
  NetworkDataType *in_RDI;
  
  NetworkDataType::NetworkDataType(in_RDI);
  in_RDI->_vptr_NetworkDataType = (_func_int **)&PTR__HighFreqDataType_003755b0;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 5));
  std::__cxx11::string::string((string *)(in_RDI + 9));
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 9),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0xd),"");
  *(undefined4 *)&in_RDI[0x11]._vptr_NetworkDataType = 0;
  return;
}

Assistant:

HighFreqDataType::HighFreqDataType() : NetworkDataType() {
    name = "";
    origin = "";
    dataFormat = "";
    sockAddr = "";
    byteSize = 0;
}